

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O2

int oonf_viewer_call_subcommands
              (autobuf *out,abuf_template_storage *storage,char *param,
              oonf_viewer_template *templates,size_t count)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  oonf_viewer_template *poVar4;
  oonf_viewer_template *template;
  long lVar5;
  _Bool _Var6;
  _Bool local_48;
  _Bool local_44;
  
  pcVar2 = str_hasnextword(param,"head");
  if (pcVar2 == (char *)0x0) {
    pcVar3 = str_hasnextword(param,"json");
    if (pcVar3 != (char *)0x0) {
      local_44 = true;
      goto LAB_0011592d;
    }
    pcVar3 = str_hasnextword(param,"raw");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = str_hasnextword(param,"jsonraw");
      if (pcVar3 == (char *)0x0) {
        pcVar3 = str_hasnextword(param,"data");
        if (pcVar3 == (char *)0x0) {
          pcVar3 = str_hasnextword(param,"dataraw");
          local_44 = pcVar3 != (char *)0x0;
          local_48 = local_44;
          _Var6 = local_44;
          if (local_44) {
            param = pcVar3;
          }
        }
        else {
          local_44 = true;
          local_48 = false;
          param = pcVar3;
          _Var6 = true;
        }
      }
      else {
        local_44 = true;
        local_48 = true;
        param = pcVar3;
        _Var6 = false;
      }
      goto LAB_00115937;
    }
    local_48 = true;
    local_44 = false;
  }
  else {
    local_44 = false;
    pcVar3 = pcVar2;
LAB_0011592d:
    local_48 = false;
  }
  param = pcVar3;
  _Var6 = false;
LAB_00115937:
  lVar5 = count + 1;
  template = templates + -1;
  do {
    poVar4 = template;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return 1;
    }
    template = poVar4 + 1;
    pcVar3 = str_hasnextword(param,poVar4[1].json_name);
  } while (pcVar3 == (char *)0x0);
  poVar4[1].create_json = local_44;
  poVar4[1].create_raw = local_48;
  poVar4[1].create_only_data = _Var6;
  oonf_viewer_output_prepare(template,storage,out,pcVar3);
  if (pcVar2 == (char *)0x0) {
    iVar1 = (*poVar4[1].cb_function)(template);
  }
  else {
    abuf_add_template(out,poVar4[1]._storage,true);
    abuf_puts(out,"\n");
    iVar1 = 0;
  }
  oonf_viewer_output_finish(template);
  return iVar1;
}

Assistant:

int
oonf_viewer_call_subcommands(struct autobuf *out, struct abuf_template_storage *storage, const char *param,
  struct oonf_viewer_template *templates, size_t count) {
  const char *next = NULL, *ptr = NULL;
  int result = 0;
  size_t i;
  bool head = false;
  bool json = false;
  bool raw = false;
  bool data = false;

  if ((next = str_hasnextword(param, OONF_VIEWER_HEAD_FORMAT))) {
    head = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_FORMAT))) {
    json = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_RAW_FORMAT))) {
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_RAW_FORMAT))) {
    json = true;
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_FORMAT))) {
    json = true;
    data = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_RAW_FORMAT))) {
    json = true;
    raw = true;
    data = true;
  }
  else {
    next = param;
  }

  for (i = 0; i < count; i++) {
    if ((ptr = str_hasnextword(next, templates[i].json_name))) {
      templates[i].create_json = json;
      templates[i].create_raw = raw;
      templates[i].create_only_data = data;

      oonf_viewer_output_prepare(&templates[i], storage, out, ptr);

      if (head) {
        abuf_add_template(out, templates[i]._storage, true);
        abuf_puts(out, "\n");
      }
      else {
        result = templates[i].cb_function(&templates[i]);
      }

      oonf_viewer_output_finish(&templates[i]);

      return result;
    }
  }
  return 1;
}